

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::ensurePlainTextEdit(QInputDialogPrivate *this)

{
  QWidget *parent;
  void **ppvVar1;
  QPlainTextEdit *pQVar2;
  QWidgetPrivate *pQVar3;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->plainTextEdit == (QPlainTextEdit *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    pQVar2 = (QPlainTextEdit *)operator_new(0x28);
    QPlainTextEdit::QPlainTextEdit(pQVar2,parent);
    this->plainTextEdit = pQVar2;
    QPlainTextEdit::setLineWrapMode(pQVar2,NoWrap);
    pQVar3 = qt_widget_private((QWidget *)this->plainTextEdit);
    pQVar3->field_0x253 = pQVar3->field_0x253 | 4;
    QWidget::hide((QWidget *)this->plainTextEdit);
    pQVar2 = this->plainTextEdit;
    local_48 = QPlainTextEdit::textChanged;
    local_40 = 0;
    local_58 = plainTextEditTextChanged;
    local_50 = (ImplFn)0x0;
    ppvVar1 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QInputDialogPrivate::*)(),_QtPrivate::List<>,_void>::
         impl;
    *(code **)(puVar4 + 4) = plainTextEditTextChanged;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)pQVar2,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensurePlainTextEdit()
{
    Q_Q(QInputDialog);
    if (!plainTextEdit) {
        plainTextEdit = new QPlainTextEdit(q);
        plainTextEdit->setLineWrapMode(QPlainTextEdit::NoWrap);
#ifndef QT_NO_IM
        qt_widget_private(plainTextEdit)->inheritsInputMethodHints = 1;
#endif
        plainTextEdit->hide();
        QObjectPrivate::connect(plainTextEdit, &QPlainTextEdit::textChanged,
                                this, &QInputDialogPrivate::plainTextEditTextChanged);
    }
}